

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O2

void getLogTime(char *timeResult,size_t len)

{
  tm *__tp;
  size_t sVar1;
  time_t agent_time;
  
  if ((timeResult != (char *)0x0) &&
     (((agent_time = get_time((time_t *)0x0), agent_time == -1 ||
       (__tp = localtime(&agent_time), __tp == (tm *)0x0)) ||
      (sVar1 = strftime(timeResult,0x10,"%H:%M:%S",__tp), sVar1 == 0)))) {
    *timeResult = '\0';
  }
  return;
}

Assistant:

static void getLogTime(char* timeResult, size_t len)
{
    if (timeResult != NULL)
    {
        time_t agent_time = get_time(NULL);
        if (agent_time == (time_t)-1)
        {
            timeResult[0] = '\0';
        }
        else
        {
            struct tm* tmInfo = localtime(&agent_time);
            if (tmInfo == NULL)
            {
                timeResult[0] = '\0';
            }
            else
            {
                if (strftime(timeResult, len, "%H:%M:%S", tmInfo) == 0)
                {
                    timeResult[0] = '\0';
                }
            }
        }
    }
}